

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

int __thiscall
GEO::geofile::import_line
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector,string *import_path,int *line_number)

{
  bool bVar1;
  reference pvVar2;
  ostream *poVar3;
  int local_50;
  pair<const_int,_GEO::line> local_4c;
  int local_40;
  int local_3c;
  int end;
  int start;
  line input_line;
  int *line_number_local;
  string *import_path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *split_string_vector_local;
  geofile *this_local;
  
  input_line = (line)line_number;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](split_string_vector,1);
  bVar1 = is_integer(pvVar2);
  if (bVar1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](split_string_vector,2);
    bVar1 = is_integer(pvVar2);
    if (bVar1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](split_string_vector,3);
      bVar1 = is_integer(pvVar2);
      if (bVar1) {
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](split_string_vector,2);
        local_3c = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](split_string_vector,3);
        local_40 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
        end = local_3c;
        start = local_40;
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](split_string_vector,1);
        local_50 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
        std::pair<const_int,_GEO::line>::pair<int,_GEO::line_&,_true>
                  (&local_4c,&local_50,(line *)&end);
        std::map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
        ::insert(&this->lines_map,&local_4c);
        return 0;
      }
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Error: Invalid value (line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)input_line);
  poVar3 = std::operator<<(poVar3," of ");
  poVar3 = std::operator<<(poVar3,(string *)import_path);
  poVar3 = std::operator<<(poVar3,")");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return 1;
}

Assistant:

int GEO::geofile::import_line( std::vector<std::string> &split_string_vector,
                                std::string &import_path,
                                int &line_number)
{
    if ((is_integer(split_string_vector[1])==true)&&
        (is_integer(split_string_vector[2])==true)&&
        (is_integer(split_string_vector[3])==true))
    {
        line input_line;
        auto start = std::stoi(split_string_vector[2]);
        auto end   = std::stoi(split_string_vector[3]);
        input_line.start = start;
        input_line.end = end;
        lines_map.insert({std::stoi(split_string_vector[1]), input_line});
        return EXIT_SUCCESS;
    }
    else
    {
        std::cout << "Error: Invalid value (line "
        << line_number << " of "
        << import_path << ")" << std::endl;
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;
}